

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  bool bVar1;
  string *psVar2;
  RootPathMode RVar3;
  string rootPathMode;
  string findRootPathVar;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&findRootPathVar,"CMAKE_FIND_ROOT_PATH_MODE_",
             (allocator<char> *)&rootPathMode);
  std::__cxx11::string::append((string *)&findRootPathVar);
  psVar2 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,&findRootPathVar);
  std::__cxx11::string::string((string *)&rootPathMode,(string *)psVar2);
  bVar1 = std::operator==(&rootPathMode,"NEVER");
  RVar3 = RootPathModeNever;
  if (!bVar1) {
    bVar1 = std::operator==(&rootPathMode,"ONLY");
    if (bVar1) {
      RVar3 = RootPathModeOnly;
    }
    else {
      bVar1 = std::operator==(&rootPathMode,"BOTH");
      if (!bVar1) goto LAB_002f2c84;
      RVar3 = RootPathModeBoth;
    }
  }
  this->FindRootPathMode = RVar3;
LAB_002f2c84:
  std::__cxx11::string::~string((string *)&rootPathMode);
  std::__cxx11::string::~string((string *)&findRootPathVar);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar = "CMAKE_FIND_ROOT_PATH_MODE_";
  findRootPathVar += this->CMakePathName;
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode == "NEVER") {
    this->FindRootPathMode = RootPathModeNever;
  } else if (rootPathMode == "ONLY") {
    this->FindRootPathMode = RootPathModeOnly;
  } else if (rootPathMode == "BOTH") {
    this->FindRootPathMode = RootPathModeBoth;
  }
}